

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compiler.cpp
# Opt level: O3

bool SaveListing(CompilerContext *ctx,char *fileName)

{
  int iVar1;
  void *pvVar2;
  char *src;
  bool bVar3;
  TraceScope traceScope;
  InstructionRegVmLowerGraphContext instLowerGraphCtx;
  TraceScope TStack_48;
  InstructionRegVmLowerGraphContext local_38;
  
  if (SaveListing(CompilerContext&,char_const*)::token == '\0') {
    iVar1 = __cxa_guard_acquire(&SaveListing(CompilerContext&,char_const*)::token);
    if (iVar1 != 0) {
      SaveListing::token = NULLC::TraceGetToken("compiler","SaveListing");
      __cxa_guard_release(&SaveListing(CompilerContext&,char_const*)::token);
    }
  }
  NULLC::TraceScope::TraceScope(&TStack_48,SaveListing::token);
  if (ctx->regVmLoweredModule == (RegVmLoweredModule *)0x0) {
    src = "ERROR: no bytecode was built";
  }
  else {
    if ((ctx->outputCtx).stream != (void *)0x0) {
      __assert_fail("!ctx.outputCtx.stream",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Compiler.cpp"
                    ,0x7d9,"bool SaveListing(CompilerContext &, const char *)");
    }
    pvVar2 = (*(ctx->outputCtx).openStream)(fileName);
    (ctx->outputCtx).stream = pvVar2;
    if (pvVar2 != (void *)0x0) {
      local_38.output = &ctx->outputCtx;
      local_38.code = (char *)0x0;
      local_38.lastStart = (char *)0x0;
      local_38.lastStartOffset = 0;
      local_38.lastEndOffset = 0;
      local_38.showSource = true;
      local_38.showAnnotatedSource = false;
      PrintGraph(&local_38,ctx->regVmLoweredModule);
      (*(ctx->outputCtx).closeStream)((ctx->outputCtx).stream);
      (ctx->outputCtx).stream = (void *)0x0;
      bVar3 = true;
      goto LAB_0023faa5;
    }
    src = "ERROR: failed to open file";
  }
  bVar3 = false;
  NULLC::SafeSprintf(ctx->errorBuf,(ulong)ctx->errorBufSize,src);
LAB_0023faa5:
  NULLC::TraceScope::~TraceScope(&TStack_48);
  return bVar3;
}

Assistant:

bool SaveListing(CompilerContext &ctx, const char *fileName)
{
	TRACE_SCOPE("compiler", "SaveListing");

	if(!ctx.regVmLoweredModule)
	{
		NULLC::SafeSprintf(ctx.errorBuf, ctx.errorBufSize, "ERROR: no bytecode was built");
		return false;
	}

	assert(!ctx.outputCtx.stream);
	ctx.outputCtx.stream = ctx.outputCtx.openStream(fileName);

	if(!ctx.outputCtx.stream)
	{
		NULLC::SafeSprintf(ctx.errorBuf, ctx.errorBufSize, "ERROR: failed to open file");
		return false;
	}

	InstructionRegVmLowerGraphContext instLowerGraphCtx(ctx.outputCtx);

	instLowerGraphCtx.showSource = true;

	PrintGraph(instLowerGraphCtx, ctx.regVmLoweredModule);

	ctx.outputCtx.closeStream(ctx.outputCtx.stream);
	ctx.outputCtx.stream = NULL;

	return true;
}